

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::SerialArena
          (SerialArena *this,__pointer_type param_2,ThreadSafeArena *param_3)

{
  bool bVar1;
  char *ptr;
  char *pcVar2;
  ThreadSafeArena *parent_local;
  ArenaBlock *b_local;
  SerialArena *this_local;
  
  std::atomic<char_*>::atomic(&this->ptr_,(__pointer_type)0x0);
  this->limit_ = (char *)0x0;
  this->prefetch_ptr_ = (char *)0x0;
  cleanup::ChunkList::ChunkList(&this->cleanup_list_);
  std::atomic<google::protobuf::internal::StringBlock_*>::atomic
            (&this->string_block_,(__pointer_type)0x0);
  std::atomic<unsigned_long>::atomic(&this->string_block_unused_,0);
  std::atomic<google::protobuf::internal::ArenaBlock_*>::atomic(&this->head_,param_2);
  std::atomic<unsigned_long>::atomic(&this->space_used_,0);
  std::atomic<unsigned_long>::atomic(&this->space_allocated_,param_2->size);
  this->parent_ = param_3;
  this->cached_block_length_ = '\0';
  this->cached_blocks_ = (CachedBlock **)0x0;
  bVar1 = ArenaBlock::IsSentry(param_2);
  if (!bVar1) {
    ptr = ArenaBlock::Pointer(param_2,0x10);
    pcVar2 = ArenaBlock::Limit(param_2);
    set_ptr(this,ptr);
    this->prefetch_ptr_ = ptr;
    this->limit_ = pcVar2;
  }
  return;
}

Assistant:

SerialArena::SerialArena(FirstSerialArena, ArenaBlock* b,
                         ThreadSafeArena& parent)
    : head_{b}, space_allocated_{b->size}, parent_{parent} {
  if (b->IsSentry()) return;
  set_range(b->Pointer(kBlockHeaderSize), b->Limit());
}